

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::~IfcLShapeProfileDef(IfcLShapeProfileDef *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x91db78;
  *(undefined8 *)&this->field_0xf0 = 0x91dba0;
  pcVar2 = (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr._M_dataplus.
           _M_p;
  paVar1 = &(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.ProfileName.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  puVar3 = *(undefined1 **)
            &(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10;
  puVar4 = &(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  if (puVar3 != puVar4) {
    operator_delete(puVar3,*(long *)puVar4 + 1);
    return;
  }
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}